

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# azure_base64.c
# Opt level: O2

STRING_HANDLE Base64_Encode_Internal(uchar *source,size_t size)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char *pcVar7;
  LOGGER_LOG p_Var8;
  STRING_HANDLE pSVar9;
  int iVar10;
  size_t sVar11;
  size_t __size;
  ulong uVar12;
  
  if (size == 0) {
    sVar11 = 0;
  }
  else {
    sVar11 = 0xffffffffffffffff;
    if (size < 0xbffffffffffffffe) {
      sVar11 = ((size - 1) / 3) * 4 + 4;
    }
  }
  __size = sVar11 + 1;
  if (sVar11 + 1 == 0) {
    __size = 0xffffffffffffffff;
  }
  if (__size == 0xffffffffffffffff) {
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 == (LOGGER_LOG)0x0) {
      return (STRING_HANDLE)0x0;
    }
    pcVar7 = "Azure_Base64_Encode:: Invalid size parameter, neededSize:%zu.";
    iVar10 = 0xf9;
    goto LAB_0013b13b;
  }
  pcVar7 = (char *)malloc(__size);
  if (pcVar7 == (char *)0x0) {
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 == (LOGGER_LOG)0x0) {
      return (STRING_HANDLE)0x0;
    }
    pcVar7 = "Azure_Base64_Encode:: Allocation failed.";
    iVar10 = 0xff;
    goto LAB_0013b13b;
  }
  uVar12 = 4;
  while (2 < size) {
    if (__size < uVar12) {
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0013b2e5;
      iVar10 = 0x11b;
      goto LAB_0013b2e0;
    }
    bVar1 = source[2];
    cVar3 = base64char(bVar1 & 0x3f);
    bVar2 = source[1];
    cVar4 = base64char(bVar2 * '\x04' & 0x3f | bVar1 >> 6);
    bVar1 = *source;
    cVar5 = base64char((bVar1 & 3) << 4 | bVar2 >> 4);
    cVar6 = base64char(bVar1 >> 2);
    pcVar7[uVar12 - 4] = cVar6;
    pcVar7[uVar12 - 3] = cVar5;
    pcVar7[uVar12 - 2] = cVar4;
    pcVar7[uVar12 - 1] = cVar3;
    uVar12 = uVar12 + 4;
    source = source + 3;
    size = size - 3;
  }
  if (size == 2) {
    if (__size < uVar12) {
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0013b2e5;
      iVar10 = 0x12a;
    }
    else {
      bVar1 = *source;
      cVar3 = base64char(bVar1 >> 2);
      bVar2 = source[1];
      cVar4 = base64char(bVar2 >> 4 | (bVar1 & 3) << 4);
      cVar5 = (char)(*(uint *)(&DAT_00151d90 + (bVar2 & 0xc)) >> ((bVar2 & 3) << 3));
LAB_0013b292:
      pcVar7[uVar12 - 4] = cVar3;
      pcVar7[uVar12 - 3] = cVar4;
      pcVar7[uVar12 - 2] = cVar5;
      pcVar7[uVar12 - 1] = '=';
LAB_0013b2aa:
      if (uVar12 + 1 <= __size) {
        pcVar7[uVar12] = '\0';
        pSVar9 = STRING_new_with_memory(pcVar7);
        if (pSVar9 != (STRING_HANDLE)0x0) {
          return pSVar9;
        }
        free(pcVar7);
        p_Var8 = xlogging_get_log_function();
        if (p_Var8 == (LOGGER_LOG)0x0) {
          return (STRING_HANDLE)0x0;
        }
        pcVar7 = "Azure_Base64_Encode:: Allocation failed for return value.";
        iVar10 = 0x167;
LAB_0013b13b:
        (*p_Var8)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/azure_base64.c"
                  ,"Base64_Encode_Internal",iVar10,1,pcVar7);
        return (STRING_HANDLE)0x0;
      }
      p_Var8 = xlogging_get_log_function();
      if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0013b2e5;
      iVar10 = 0x152;
    }
  }
  else {
    if (size != 1) {
      uVar12 = uVar12 - 4;
      goto LAB_0013b2aa;
    }
    if (uVar12 <= __size) {
      bVar1 = *source;
      cVar3 = base64char(bVar1 >> 2);
      cVar4 = (char)(0x77675141 >> ((bVar1 & 3) << 3));
      cVar5 = '=';
      goto LAB_0013b292;
    }
    p_Var8 = xlogging_get_log_function();
    if (p_Var8 == (LOGGER_LOG)0x0) goto LAB_0013b2e5;
    iVar10 = 0x13f;
  }
LAB_0013b2e0:
  (*p_Var8)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/azure_base64.c"
            ,"Base64_Encode_Internal",iVar10,1,"Azure_Base64_Encode:: Invalid buffer size.");
LAB_0013b2e5:
  free(pcVar7);
  return (STRING_HANDLE)0x0;
}

Assistant:

static STRING_HANDLE Base64_Encode_Internal(const unsigned char* source, size_t size)
{
    STRING_HANDLE result;
    size_t neededSize = 0;
    bool isBufferOverflow = false;
    char* encoded;
    size_t currentPosition = 0;
    neededSize = safe_add_size_t(neededSize, (size == 0) ? (0) : safe_multiply_size_t(safe_add_size_t(((safe_subtract_size_t(size, 1)) / 3), 1), 4));
    neededSize = safe_add_size_t(neededSize, 1);  /*+1 because \0 at the end of the string*/

    if (neededSize == 0 || neededSize == SIZE_MAX)
    {
        result = NULL;
        LogError("Azure_Base64_Encode:: Invalid size parameter, neededSize:%zu.", neededSize);
    }
    /*Codes_SRS_BASE64_06_006: [If when allocating memory to produce the encoding a failure occurs then Azure_Base64_Encode shall return NULL.]*/
    else if ((encoded = (char*)malloc(neededSize)) == NULL)
    {
        result = NULL;
        LogError("Azure_Base64_Encode:: Allocation failed.");
    }
    else
    {
        /*b0            b1(+1)          b2(+2)
        7 6 5 4 3 2 1 0 7 6 5 4 3 2 1 0 7 6 5 4 3 2 1 0
        |----c1---| |----c2---| |----c3---| |----c4---|
        */

        size_t destinationPosition = 0;
        while (size - currentPosition >= 3)
        {
            char c1 = base64char(source[currentPosition] >> 2);
            char c2 = base64char(
                ((source[currentPosition] & 3) << 4) |
                    (source[currentPosition + 1] >> 4)
            );
            char c3 = base64char(
                ((source[currentPosition + 1] & 0x0F) << 2) |
                    ((source[currentPosition + 2] >> 6) & 3)
            );
            char c4 = base64char(
                source[currentPosition + 2] & 0x3F
            );
            currentPosition += 3;

            if ((destinationPosition + 4) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
                break;
            }
            encoded[destinationPosition++] = c1;
            encoded[destinationPosition++] = c2;
            encoded[destinationPosition++] = c3;
            encoded[destinationPosition++] = c4;

        }

        if (!isBufferOverflow && size - currentPosition == 2)
        {
            if ((destinationPosition + 4) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
            }
            else
            {
                char c1 = base64char(source[currentPosition] >> 2);
                char c2 = base64char(
                    ((source[currentPosition] & 0x03) << 4) |
                    (source[currentPosition + 1] >> 4)
                );
                char c3 = base64b16(source[currentPosition + 1] & 0x0F);
                encoded[destinationPosition++] = c1;
                encoded[destinationPosition++] = c2;
                encoded[destinationPosition++] = c3;
                encoded[destinationPosition++] = '=';
            }
        }
        else if (!isBufferOverflow && size - currentPosition == 1)
        {
            if ((destinationPosition + 4) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
            }
            else
            {
                char c1 = base64char(source[currentPosition] >> 2);
                char c2 = base64b8(source[currentPosition] & 0x03);
                encoded[destinationPosition++] = c1;
                encoded[destinationPosition++] = c2;
                encoded[destinationPosition++] = '=';
                encoded[destinationPosition++] = '=';
            }
        }

        /*null terminating the string*/
        if (!isBufferOverflow)
        {
            if ((destinationPosition + 1) > neededSize)
            {
                LogError("Azure_Base64_Encode:: Invalid buffer size.");
                isBufferOverflow = true;
            }
            else
            {
                encoded[destinationPosition] = '\0';
            }
        }

        if (isBufferOverflow)
        {
            free(encoded);
            result = NULL;
        }
        else
        {
            /*Codes_SRS_BASE64_06_007: [Otherwise Azure_Base64_Encode shall return a pointer to STRING, that string contains the base 64 encoding of input.]*/
            result = STRING_new_with_memory(encoded);
            if (result == NULL)
            {
                free(encoded);
                LogError("Azure_Base64_Encode:: Allocation failed for return value.");
            }
        }
    }
    return result;
}